

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentPOMDP.cpp
# Opt level: O1

void __thiscall AgentPOMDP::AgentPOMDP(AgentPOMDP *this,AgentPOMDP *a)

{
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  QAV<PerseusPOMDPPlanner> *pQVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  JointBeliefInterface *pJVar4;
  
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
  _vptr_SimulationAgent = (_func_int **)&PTR__SimulationAgent_005a8538;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent._m_id =
       (a->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent._m_id;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent._m_verbose
       = (a->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
         _m_verbose;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
  _vptr_SimulationAgent = (_func_int **)&PTR__AgentPOMDP_005a8438;
  pPVar1 = (a->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu;
  pQVar2 = a->_m_QPOMDP;
  (this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu =
       (a->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu;
  this->_m_QPOMDP = pQVar2;
  this->_m_t = a->_m_t;
  this->_m_prevJaI = a->_m_prevJaI;
  iVar3 = (*(pPVar1->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[10])();
  pJVar4 = (JointBeliefInterface *)CONCAT44(extraout_var,iVar3);
  this->_m_jb = pJVar4;
  (**(code **)((long)*pJVar4 + 0xa8))(pJVar4,a->_m_jb,extraout_RDX,*(code **)((long)*pJVar4 + 0xa8))
  ;
  return;
}

Assistant:

AgentPOMDP::AgentPOMDP(const AgentPOMDP& a) :
    AgentSharedObservations(a),
    _m_QPOMDP(a._m_QPOMDP),
    _m_t(a._m_t),
    _m_prevJaI(a._m_prevJaI)
{
    _m_jb=GetPU()->GetNewJointBeliefInterface();
    *_m_jb=*a._m_jb;
}